

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckTransformFeedbackResult
          (FunctionalTest *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  bool bVar5;
  GLint output_data [7];
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 local_1ac;
  undefined4 uStack_1a8;
  undefined8 uStack_1a4;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uStack_1a8 = 0;
  uStack_1a4 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1ac = 0;
  (*this->m_pGetNamedBufferSubData)(this->m_bo_out,0,0x1c,&local_1b8);
  iVar3 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  if (iVar3 == 0) {
    if ((int)local_1b8 == 0) {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        if (uVar4 == 6) {
          return 5 < uVar4;
        }
        uVar2 = uVar4 + 1;
      } while (*(int *)(s_expected_data + uVar4 * 4 + 4) ==
               *(int *)((long)&local_1b8 + uVar4 * 4 + 4));
      bVar5 = 5 < uVar4;
    }
    else {
      bVar5 = false;
    }
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expected data is not equal to results.",0x26);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
  }
  else {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GetNamedBufferSubData has failed.",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool FunctionalTest::CheckTransformFeedbackResult()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local data storage. */
	glw::GLint output_data[sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0])] = {};

	/* Fetch data. */
	m_pGetNamedBufferSubData(m_bo_out, 0, sizeof(output_data), output_data);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		for (glw::GLuint i = 0; i < sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0]); ++i)
		{
			if (s_expected_data[i] != output_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Expected data is not equal to results."
													<< tcu::TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferSubData has failed."
											<< tcu::TestLog::EndMessage;
	}
	return false;
}